

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CompoundString.cpp
# Opt level: O3

Block * __thiscall Js::CompoundString::BlockInfo::Resize(BlockInfo *this,Recycler *recycler)

{
  Block *pBVar1;
  void *address;
  code *pcVar2;
  Type TVar3;
  bool bVar4;
  uint uVar5;
  CharCount CVar6;
  BOOL BVar7;
  undefined4 *puVar8;
  Recycler *this_00;
  char16 *dst;
  Block *pBVar9;
  uint charCapacity;
  undefined1 local_58 [8];
  TrackAllocData data;
  
  if (recycler == (Recycler *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar8 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/CompoundString.cpp"
                                ,0x191,"(recycler)","recycler");
    if (!bVar4) goto LAB_00b28d92;
    *puVar8 = 0;
  }
  uVar5 = this->charLength + (uint)(this->charLength == 0);
  charCapacity = uVar5 + 7 & 0xfffffff8;
  if (charCapacity < uVar5) {
    ::Math::DefaultOverflowPolicy();
  }
  CVar6 = GrowCharCapacity(charCapacity);
  bVar4 = ShouldAllocateBuffer(CVar6);
  if (bVar4) {
    local_58 = (undefined1  [8])&char16_t::typeinfo;
    data.typeinfo = (type_info *)0x0;
    data.count = (size_t)anon_var_dwarf_60f7942;
    data.filename._0_4_ = 0x196;
    data.plusSize = (ulong)CVar6;
    this_00 = Memory::Recycler::TrackAllocInfo(recycler,(TrackAllocData *)local_58);
    if (CVar6 == 0) {
      Memory::Recycler::ClearTrackAllocInfo(this_00,(TrackAllocData *)0x0);
      dst = (char16 *)&DAT_00000008;
    }
    else {
      BVar7 = ExceptionCheck::CanHandleOutOfMemory();
      if (BVar7 == 0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar8 = 1;
        bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                    ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                                    "ExceptionCheck::CanHandleOutOfMemory()");
        if (!bVar4) goto LAB_00b28d92;
        *puVar8 = 0;
      }
      dst = (char16 *)
            Memory::Recycler::AllocWithAttributesInlined<(Memory::ObjectInfoBits)256,false>
                      (this_00,(ulong)CVar6 * 2);
      if (dst == (char16 *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar8 = 1;
        bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                                    ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
        if (!bVar4) {
LAB_00b28d92:
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        *puVar8 = 0;
        dst = (char16 *)0x0;
      }
    }
    this->charCapacity = CVar6;
    uVar5 = this->charLength;
    CVar6 = Block::PointerLengthFromCharLength(CVar6);
    Memory::Recycler::WBSetBitRange((char *)dst,CVar6);
    js_wmemcpy_s(dst,(ulong)this->charCapacity,(char16 *)(this->buffer).ptr,(ulong)uVar5);
    Memory::Recycler::WBSetBit((char *)this);
    (this->buffer).ptr = dst;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(this);
    address = (this->buffer).ptr;
    CVar6 = Block::PointerLengthFromCharLength(this->charLength);
    Memory::RecyclerWriteBarrierManager::WriteBarrier(address,(ulong)CVar6 << 3);
    pBVar9 = (Block *)0x0;
  }
  else {
    pBVar9 = Block::New((this->buffer).ptr,this->charLength,true,recycler);
    pBVar1 = (pBVar9->bufferOwner).ptr;
    Memory::Recycler::WBSetBit((char *)this);
    (this->buffer).ptr = pBVar1 + 1;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(this);
    TVar3 = pBVar9->charCapacity;
    this->charLength = pBVar9->charLength;
    this->charCapacity = TVar3;
  }
  return pBVar9;
}

Assistant:

CompoundString::Block *CompoundString::BlockInfo::Resize(Recycler *const recycler)
    {
        Assert(recycler);

        const CharCount newCharCapacity = GrowCharCapacity(AlignCharCapacityForAllocation(CharLength()));
        if(ShouldAllocateBuffer(newCharCapacity))
        {
            void *const newBuffer = RecyclerNewArray(recycler, char16, newCharCapacity);
            charCapacity = newCharCapacity;
            const CharCount charLength = CharLength();

            ArrayWriteBarrierVerifyBits(Block::Pointers(newBuffer), Block::PointerLengthFromCharLength(charCapacity));
            js_wmemcpy_s((char16*)newBuffer, charCapacity, (char16*)PointerValue(buffer), charLength);
            buffer = newBuffer;
            // SWB: buffer may contain chars or pointers. Trigger write barrier for the whole buffer.
            ArrayWriteBarrier(Pointers(), PointerLength());
            return nullptr;
        }

        Block *const block = Block::New(buffer, CharLength(), true, recycler);
        CopyFrom(block);
        return block;
    }